

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long local_40;
  ssize_t bytes_avail;
  cab *cab;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  if (*(long *)(bytes_avail + 8) == 0) {
    *buff = (void *)0x0;
    *size = 0;
    *offset = *(int64_t *)bytes_avail;
    *(undefined1 *)(bytes_avail + 0x92) = 1;
    a_local._4_4_ = L'\0';
  }
  else {
    cab = (cab *)offset;
    offset_local = (int64_t *)size;
    size_local = (size_t *)buff;
    buff_local = (void **)a;
    pvVar1 = cab_read_ahead_cfdata(a,&local_40);
    *size_local = (size_t)pvVar1;
    if (local_40 < 1) {
      *size_local = 0;
      *offset_local = 0;
      cab->entry_offset = 0;
      if ((local_40 == 0) && (*(short *)(*(long *)(bytes_avail + 0x38) + 8) == 0)) {
        archive_set_error((archive *)buff_local,0x54,"Invalid CFDATA");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        a_local._4_4_ = (wchar_t)local_40;
      }
    }
    else {
      if (*(long *)(bytes_avail + 8) < local_40) {
        local_40 = *(long *)(bytes_avail + 8);
      }
      *offset_local = local_40;
      cab->entry_offset = *(int64_t *)bytes_avail;
      *(long *)bytes_avail = local_40 + *(long *)bytes_avail;
      *(long *)(bytes_avail + 8) = *(long *)(bytes_avail + 8) - local_40;
      if (*(long *)(bytes_avail + 8) == 0) {
        *(undefined1 *)(bytes_avail + 0x92) = 1;
      }
      *(long *)(bytes_avail + 0x10) = local_40;
      if ((*(short *)(*(long *)(bytes_avail + 0x28) + 6) == 0) &&
         (*(long *)(bytes_avail + 0x10) < *(long *)(*(long *)(bytes_avail + 0x38) + 0x10))) {
        *(undefined8 *)(*(long *)(bytes_avail + 0x38) + 0x10) = *(undefined8 *)(bytes_avail + 0x10);
      }
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
cab_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	ssize_t bytes_avail;

	if (cab->entry_bytes_remaining == 0) {
		*buff = NULL;
		*size = 0;
		*offset = cab->entry_offset;
		cab->end_of_entry = 1;
		return (ARCHIVE_OK);
	}

	*buff = cab_read_ahead_cfdata(a, &bytes_avail);
	if (bytes_avail <= 0) {
		*buff = NULL;
		*size = 0;
		*offset = 0;
		if (bytes_avail == 0 &&
		    cab->entry_cfdata->uncompressed_size == 0) {
			/* All of CFDATA in a folder has been handled. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT, "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		} else
			return ((int)bytes_avail);
	}
	if (bytes_avail > cab->entry_bytes_remaining)
		bytes_avail = (ssize_t)cab->entry_bytes_remaining;

	*size = bytes_avail;
	*offset = cab->entry_offset;
	cab->entry_offset += bytes_avail;
	cab->entry_bytes_remaining -= bytes_avail;
	if (cab->entry_bytes_remaining == 0)
		cab->end_of_entry = 1;
	cab->entry_unconsumed = bytes_avail;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		/* Don't consume more than current entry used. */
		if (cab->entry_cfdata->unconsumed > cab->entry_unconsumed)
			cab->entry_cfdata->unconsumed = cab->entry_unconsumed;
	}
	return (ARCHIVE_OK);
}